

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_getRCycles_internal(RDL_data *data,RDL_cycle ***ptr,RDL_cycleIterator *it)

{
  int iVar1;
  RDL_cycle *pRVar2;
  RDL_cycle **ppRVar3;
  undefined4 local_30;
  undefined4 local_2c;
  uint nextfree;
  uint alloced;
  RDL_cycle **result;
  RDL_cycleIterator *it_local;
  RDL_cycle ***ptr_local;
  RDL_data *data_local;
  
  local_2c = 0x40;
  local_30 = 0;
  _nextfree = malloc(0x200);
  while( true ) {
    iVar1 = RDL_cycleIteratorAtEnd(it);
    if (iVar1 != 0) break;
    if (local_30 == local_2c) {
      local_2c = local_2c << 1;
      _nextfree = realloc(_nextfree,(ulong)local_2c << 3);
    }
    pRVar2 = RDL_cycleIteratorGetCycle(it);
    *(RDL_cycle **)((long)_nextfree + (ulong)local_30 * 8) = pRVar2;
    local_30 = local_30 + 1;
    RDL_cycleIteratorNext(it);
  }
  RDL_deleteCycleIterator(it);
  ppRVar3 = (RDL_cycle **)realloc(_nextfree,(ulong)local_30 << 3);
  *ptr = ppRVar3;
  return local_30;
}

Assistant:

static unsigned RDL_getRCycles_internal(
    const RDL_data *data, RDL_cycle ***ptr, RDL_cycleIterator* it)
{
  RDL_cycle **result;
  unsigned alloced, nextfree;

  alloced = RDL_RESERVED_START;
  nextfree = 0;
  result = malloc(alloced * sizeof(*result));

  while (!RDL_cycleIteratorAtEnd(it)) {
    if(nextfree == alloced) {
      alloced *= 2;
      result = realloc(result, alloced * sizeof(*result));
    }
    result[nextfree] = RDL_cycleIteratorGetCycle(it);
    ++nextfree;

    RDL_cycleIteratorNext(it);
  }
  RDL_deleteCycleIterator(it);

  result = realloc(result, nextfree * sizeof(*result));

  *ptr = result;
  return nextfree;
}